

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_helpers.c
# Opt level: O0

void customrequest_helper(OperationConfig *config,HttpReq req,char *method)

{
  int iVar1;
  undefined8 local_48;
  char *dflt [5];
  char *method_local;
  HttpReq req_local;
  OperationConfig *config_local;
  
  dflt[4] = method;
  memcpy(&local_48,&DAT_001311c0,0x28);
  if (dflt[4] != (char *)0x0) {
    iVar1 = curl_strequal(dflt[4],dflt[(ulong)req - 1]);
    if (iVar1 == 0) {
      iVar1 = curl_strequal(dflt[4],"head");
      if (iVar1 != 0) {
        warnf(config->global,
              "Setting custom HTTP method to HEAD with -X/--request may not work the way you want. Consider using -I/--head instead.\n"
             );
      }
    }
    else {
      notef(config->global,"Unnecessary use of -X or --request, %s is already inferred.\n",
            dflt[(ulong)req - 1]);
    }
  }
  return;
}

Assistant:

void customrequest_helper(struct OperationConfig *config, HttpReq req,
                          char *method)
{
  /* this mirrors the HttpReq enum in tool_sdecls.h */
  const char *dflt[]= {
    "GET",
    "GET",
    "HEAD",
    "POST",
    "POST"
  };

  if(!method)
    ;
  else if(curl_strequal(method, dflt[req])) {
    notef(config->global, "Unnecessary use of -X or --request, %s is already "
          "inferred.\n", dflt[req]);
  }
  else if(curl_strequal(method, "head")) {
    warnf(config->global,
          "Setting custom HTTP method to HEAD with -X/--request may not work "
          "the way you want. Consider using -I/--head instead.\n");
  }
}